

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O2

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  size_t dlen;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  size_t sVar8;
  uchar *puVar9;
  uint keylen;
  uchar *puVar10;
  size_t sStack_200;
  size_t len;
  uchar *local_1f0;
  uchar pem_iv [16];
  uchar local_1c8 [24];
  mbedtls_des3_context des3_ctx;
  
  if (ctx == (mbedtls_pem_context *)0x0) {
    return -0x1480;
  }
  puVar7 = (uchar *)strstr((char *)data,header);
  if (puVar7 == (uchar *)0x0) {
    return -0x1080;
  }
  local_1f0 = (uchar *)strstr((char *)data,footer);
  if (local_1f0 <= puVar7) {
    return -0x1080;
  }
  sVar8 = strlen(header);
  lVar2 = (puVar7[sVar8] == ' ') + sVar8;
  if (puVar7[(ulong)(puVar7[(puVar7[sVar8] == ' ') + sVar8] == '\r') + lVar2] != '\n') {
    return -0x1080;
  }
  lVar2 = (ulong)(puVar7[(puVar7[sVar8] == ' ') + sVar8] == '\r') + lVar2;
  puVar9 = puVar7 + lVar2 + 1;
  sVar8 = strlen(footer);
  puVar10 = local_1f0;
  lVar3 = (local_1f0[sVar8] == ' ') + sVar8;
  *use_len = (size_t)(local_1f0 +
                     (((ulong)(local_1f0[(ulong)(local_1f0[(local_1f0[sVar8] == ' ') + sVar8] ==
                                                '\r') + lVar3] == '\n') +
                      (ulong)(local_1f0[(local_1f0[sVar8] == ' ') + sVar8] == '\r') + lVar3) -
                     (long)data));
  iVar4 = bcmp(puVar9,"Proc-Type: 4,ENCRYPTED",0x16);
  iVar6 = 0;
  if (iVar4 == 0) {
    lVar3 = lVar2 + 0x17;
    if (puVar7[lVar2 + 0x17] == '\r') {
      lVar3 = lVar2 + 0x18;
    }
    puVar10 = puVar7 + lVar3;
    if (puVar7[(ulong)(puVar7[lVar2 + 0x17] == '\r') + 0x17 + lVar2] != '\n') {
      return -0x1100;
    }
    puVar9 = puVar10 + 1;
    iVar6 = bcmp(puVar9,"DEK-Info: DES-EDE3-CBC,",0x17);
    if (iVar6 == 0) {
      iVar6 = pem_get_iv(puVar10 + 0x18,pem_iv,8);
      if (iVar6 != 0) {
        return -0x1200;
      }
      puVar9 = puVar10 + 0x28;
      iVar6 = 0x25;
LAB_0015ceb4:
      bVar1 = false;
    }
    else {
      iVar6 = bcmp(puVar9,"DEK-Info: DES-CBC,",0x12);
      if (iVar6 == 0) {
        iVar6 = pem_get_iv(puVar10 + 0x13,pem_iv,8);
        if (iVar6 != 0) {
          return -0x1200;
        }
        puVar9 = puVar10 + 0x23;
        iVar6 = 0x21;
        goto LAB_0015ceb4;
      }
      iVar6 = 0;
      bVar1 = true;
    }
    iVar5 = bcmp(puVar9,"DEK-Info: AES-",0xe);
    if (iVar5 == 0) {
      iVar6 = bcmp(puVar9,"DEK-Info: AES-128-CBC,",0x16);
      if (iVar6 == 0) {
        iVar6 = 5;
      }
      else {
        iVar6 = bcmp(puVar9,"DEK-Info: AES-192-CBC,",0x16);
        if (iVar6 == 0) {
          iVar6 = 6;
        }
        else {
          iVar6 = bcmp(puVar9,"DEK-Info: AES-256-CBC,",0x16);
          if (iVar6 != 0) {
            return -0x1280;
          }
          iVar6 = 7;
        }
      }
      iVar5 = pem_get_iv(puVar9 + 0x16,pem_iv,0x10);
      if (iVar5 != 0) {
        return -0x1200;
      }
      puVar9 = puVar9 + 0x36;
    }
    else if (bVar1) {
      return -0x1280;
    }
    if (puVar9[*puVar9 == '\r'] != '\n') {
      return -0x1100;
    }
    puVar9 = puVar9 + (ulong)(*puVar9 == '\r') + 1;
    puVar10 = local_1f0;
  }
  if (puVar9 == puVar10) {
    return -0x1100;
  }
  iVar5 = mbedtls_base64_decode((uchar *)0x0,0,&len,puVar9,(long)puVar10 - (long)puVar9);
  dlen = len;
  if (iVar5 == -0x2c) {
    return -0x112c;
  }
  puVar7 = (uchar *)calloc(1,len);
  if (puVar7 == (uchar *)0x0) {
    return -0x1180;
  }
  iVar5 = mbedtls_base64_decode(puVar7,dlen,&len,puVar9,(long)puVar10 - (long)puVar9);
  if (iVar5 != 0) {
    free(puVar7);
    return iVar5 + -0x1100;
  }
  if (iVar4 != 0) goto LAB_0015ce82;
  if (pwd == (uchar *)0x0) {
    free(puVar7);
    return -0x1300;
  }
  if (iVar6 == 5) {
    keylen = 0x10;
LAB_0015d109:
    pem_aes_decrypt(pem_iv,keylen,puVar7,len,pwd,pwdlen);
  }
  else {
    if (iVar6 == 6) {
      keylen = 0x18;
      goto LAB_0015d109;
    }
    if (iVar6 == 7) {
      keylen = 0x20;
      goto LAB_0015d109;
    }
    if (iVar6 == 0x21) {
      local_1f0 = (uchar *)len;
      mbedtls_des_init((mbedtls_des_context *)&des3_ctx);
      pem_pbkdf1(local_1c8,8,pem_iv,pwd,pwdlen);
      mbedtls_des_setkey_dec((mbedtls_des_context *)&des3_ctx,local_1c8);
      mbedtls_des_crypt_cbc
                ((mbedtls_des_context *)&des3_ctx,0,(size_t)local_1f0,pem_iv,puVar7,puVar7);
      mbedtls_des_free((mbedtls_des_context *)&des3_ctx);
      sStack_200 = 8;
LAB_0015d0dc:
      mbedtls_zeroize(local_1c8,sStack_200);
    }
    else if (iVar6 == 0x25) {
      local_1f0 = (uchar *)len;
      mbedtls_des3_init(&des3_ctx);
      pem_pbkdf1(local_1c8,0x18,pem_iv,pwd,pwdlen);
      mbedtls_des3_set3key_dec(&des3_ctx,local_1c8);
      mbedtls_des3_crypt_cbc(&des3_ctx,0,(size_t)local_1f0,pem_iv,puVar7,puVar7);
      mbedtls_des3_free(&des3_ctx);
      sStack_200 = 0x18;
      goto LAB_0015d0dc;
    }
  }
  if (((len < 3) || (*puVar7 != '0')) || (0x83 < puVar7[1])) {
    free(puVar7);
    return -0x1380;
  }
LAB_0015ce82:
  ctx->buf = puVar7;
  ctx->buflen = len;
  return 0;
}

Assistant:

int mbedtls_pem_read_buffer( mbedtls_pem_context *ctx, const char *header, const char *footer,
                     const unsigned char *data, const unsigned char *pwd,
                     size_t pwdlen, size_t *use_len )
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */

    if( ctx == NULL )
        return( MBEDTLS_ERR_PEM_BAD_INPUT_DATA );

    s1 = (unsigned char *) strstr( (const char *) data, header );

    if( s1 == NULL )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s2 = (unsigned char *) strstr( (const char *) data, footer );

    if( s2 == NULL || s2 <= s1 )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s1 += strlen( header );
    if( *s1 == ' '  ) s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;
    else return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    end = s2;
    end += strlen( footer );
    if( *end == ' '  ) end++;
    if( *end == '\r' ) end++;
    if( *end == '\n' ) end++;
    *use_len = end - data;

    enc = 0;

    if( memcmp( s1, "Proc-Type: 4,ENCRYPTED", 22 ) == 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        enc++;

        s1 += 22;
        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );


#if defined(MBEDTLS_DES_C)
        if( memcmp( s1, "DEK-Info: DES-EDE3-CBC,", 23 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if( pem_get_iv( s1, pem_iv, 8 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
        else if( memcmp( s1, "DEK-Info: DES-CBC,", 18 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if( pem_get_iv( s1, pem_iv, 8) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( memcmp( s1, "DEK-Info: AES-", 14 ) == 0 )
        {
            if( memcmp( s1, "DEK-Info: AES-128-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            else if( memcmp( s1, "DEK-Info: AES-192-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            else if( memcmp( s1, "DEK-Info: AES-256-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            else
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

            s1 += 22;
            if( pem_get_iv( s1, pem_iv, 16 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if( enc_alg == MBEDTLS_CIPHER_NONE )
            return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );
#else
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    if( s1 == s2 )
        return( MBEDTLS_ERR_PEM_INVALID_DATA );

    ret = mbedtls_base64_decode( NULL, 0, &len, s1, s2 - s1 );

    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );

    if( ( buf = mbedtls_calloc( 1, len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_decode( buf, len, &len, s1, s2 - s1 ) ) != 0 )
    {
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );
    }

    if( enc != 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        if( pwd == NULL )
        {
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_REQUIRED );
        }

#if defined(MBEDTLS_DES_C)
        if( enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC )
            pem_des3_decrypt( pem_iv, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_DES_CBC )
            pem_des_decrypt( pem_iv, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( enc_alg == MBEDTLS_CIPHER_AES_128_CBC )
            pem_aes_decrypt( pem_iv, 16, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_192_CBC )
            pem_aes_decrypt( pem_iv, 24, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_256_CBC )
            pem_aes_decrypt( pem_iv, 32, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_AES_C */

        /*
         * The result will be ASN.1 starting with a SEQUENCE tag, with 1 to 3
         * length bytes (allow 4 to be sure) in all known use cases.
         *
         * Use that as heurisitic to try detecting password mismatchs.
         */
        if( len <= 2 || buf[0] != 0x30 || buf[1] > 0x83 )
        {
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_MISMATCH );
        }
#else
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return( 0 );
}